

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O0

string * anon_unknown.dwarf_7f4f::scrape_type_text(string *__return_storage_ptr__,xml_node node)

{
  bool bVar1;
  char_t *pcVar2;
  xml_node *pxVar3;
  xml_node_iterator xVar4;
  string local_c0;
  xml_node_struct *local_a0;
  xml_node child;
  xml_node_iterator __end1;
  xml_node_iterator __begin1;
  xml_object_range<pugi::xml_node_iterator> local_68;
  xml_object_range<pugi::xml_node_iterator> *local_48;
  xml_object_range<pugi::xml_node_iterator> *__range1;
  string local_38;
  xml_node local_18;
  xml_node node_local;
  string *result;
  
  local_18._root = node._root;
  node_local._root = (xml_node_struct *)__return_storage_ptr__;
  pcVar2 = pugi::xml_node::name(&local_18);
  wire::string::string(&local_38,"apientry");
  bVar1 = std::operator==(pcVar2,&local_38.super_string);
  wire::string::~string(&local_38);
  if (bVar1) {
    wire::string::string(__return_storage_ptr__,"GLAPIENTRY");
  }
  else {
    __range1._7_1_ = 0;
    pcVar2 = pugi::xml_node::value(&local_18);
    wire::string::string(__return_storage_ptr__,pcVar2);
    pugi::xml_node::children(&local_68,&local_18);
    local_48 = &local_68;
    xVar4 = pugi::xml_object_range<pugi::xml_node_iterator>::begin(local_48);
    __end1._parent = xVar4._wrap._root;
    xVar4 = pugi::xml_object_range<pugi::xml_node_iterator>::end(local_48);
    while( true ) {
      __end1._wrap = xVar4._parent._root;
      child = xVar4._wrap._root;
      bVar1 = pugi::xml_node_iterator::operator!=
                        ((xml_node_iterator *)&__end1._parent,(xml_node_iterator *)&child);
      if (!bVar1) break;
      pxVar3 = pugi::xml_node_iterator::operator*((xml_node_iterator *)&__end1._parent);
      local_a0 = pxVar3->_root;
      scrape_type_text(&local_c0,(xml_node)local_a0);
      wire::string::operator+=(__return_storage_ptr__,&local_c0);
      wire::string::~string(&local_c0);
      pugi::xml_node_iterator::operator++((xml_node_iterator *)&__end1._parent);
      xVar4._parent._root = __end1._wrap._root;
      xVar4._wrap._root = child._root;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

wire::string scrape_type_text(const pugi::xml_node node)
{
  if (node.name() == wire::string("apientry"))
    return "GLAPIENTRY";

  wire::string result = node.value();

  for (const pugi::xml_node child : node.children())
    result += scrape_type_text(child);

  return result;
}